

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::loop(EventLoop *this)

{
  uint __line;
  pointer psVar1;
  bool bVar2;
  undefined8 in_RCX;
  nfds_t __nfds;
  char *__assertion;
  shared_ptr<Channel> *it;
  pointer peVar3;
  undefined1 local_60 [32];
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> ret;
  
  if (this->looping_ == true) {
    __assertion = "!looping_";
    __line = 0x5c;
  }
  else {
    bVar2 = isInLoopThread(this);
    if (bVar2) {
      this->looping_ = true;
      this->quit_ = false;
      local_60._24_8_ = (pointer)0x0;
      ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while (this->quit_ == false) {
        std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::clear
                  ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
                   (local_60 + 0x18));
        Epoll::poll((Epoll *)local_60,
                    (pollfd *)
                    (this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    __nfds,(int)in_RCX);
        std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::
        _M_move_assign((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                        *)(local_60 + 0x18),(Epoll *)local_60);
        std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
                  ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
                   local_60);
        psVar1 = ret.
                 super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this->eventHandling_ = true;
        for (peVar3 = (pointer)local_60._24_8_; peVar3 != (pointer)psVar1;
            peVar3 = (pointer)&peVar3[1].data) {
          Channel::handleEvents(*(Channel **)peVar3);
        }
        this->eventHandling_ = false;
        doPendingFunctors(this);
        Epoll::handleExpired
                  ((this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      this->looping_ = false;
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
                ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
                 (local_60 + 0x18));
      return;
    }
    __assertion = "isInLoopThread()";
    __line = 0x5d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                ,__line,"void EventLoop::loop()");
}

Assistant:

void EventLoop::loop() { //在哪个线程建立的对象，就在哪个线程执行loop
  assert(!looping_);
  assert(isInLoopThread());
  looping_ = true;
  quit_ = false;
  // LOG_TRACE << "EventLoop " << this << " start looping";
  std::vector<SP_Channel> ret;
  while (!quit_) {
    // cout << "doing" << endl;
    ret.clear();
    ret = poller_->poll();
    eventHandling_ = true;
    for (auto& it : ret) it->handleEvents();
    eventHandling_ = false;
    doPendingFunctors();
    poller_->handleExpired();
  }
  looping_ = false;
}